

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# game.cpp
# Opt level: O3

int __thiscall myGame::Game::loop(Game *this)

{
  bool bVar1;
  undefined8 uVar2;
  Game *this_00;
  
  while( true ) {
    this_00 = this;
    wait_key(this);
    getFood(this_00);
    Snake::move(&this->snake);
    Object::clear_dead();
    bVar1 = Snake::is_alive(&this->snake);
    if (!bVar1) break;
    redraw(this);
    usleep(10000);
  }
  uVar2 = __cxa_allocate_exception(1);
  __cxa_throw(uVar2,&finishGame::typeinfo,0);
}

Assistant:

int Game::loop(){
	try{
		while (true){
			wait_key();
			getFood();
			snake.move();
			Object::clear_dead();
			if (!snake.is_alive()){
				throw finishGame();
			}
			redraw();
			usleep(10000);
		}
	}
	catch(finishGame e){
		if (e()){
			clear();
			return snake.get_points();
		}
		else{
			return loop();
		}
	}
}